

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  float *pfVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  bool bVar3;
  float fVar4;
  float fVar5;
  char sums8_1;
  float scale_out_1;
  float sumfp32_1;
  float scale_in_1;
  char w_2;
  char val_1;
  int k_1;
  char *sptr_1;
  Mat m_4;
  int q_1;
  char *kptr_1;
  int sum_1;
  int j_2;
  int i_2;
  char *weight_data_ptr;
  char *outptr_1;
  int p;
  int g_2;
  int num_output_g;
  int channels_g_1;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  char w_1;
  char val;
  int k;
  char *sptr;
  int sum;
  int j_1;
  int i_1;
  Mat m;
  char *kptr;
  char *outptr;
  int g_1;
  size_t out_elemsize;
  bool use_int8_requantize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_q;
  int q;
  float scale;
  int g;
  float *ps;
  Mat scales;
  int channels_g;
  Mat bottom_blob_int8;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Option *in_stack_fffffffffffff418;
  float in_stack_fffffffffffff420;
  undefined4 in_stack_fffffffffffff424;
  Mat *in_stack_fffffffffffff428;
  ConvolutionDepthWise *in_stack_fffffffffffff430;
  void **ppvVar6;
  size_t in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  undefined8 in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff454;
  float local_ba4;
  float local_af4;
  Option *in_stack_fffffffffffff528;
  Mat *in_stack_fffffffffffff530;
  Mat *in_stack_fffffffffffff538;
  Mat *in_stack_fffffffffffff540;
  bool local_a29;
  float local_9d8;
  float local_9d4;
  int local_9cc;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_9a8;
  long *local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined8 local_980;
  int local_974;
  long local_970;
  int local_964;
  int local_960;
  int local_95c;
  long local_958;
  undefined8 local_950;
  undefined8 local_948;
  undefined8 local_940;
  undefined4 local_938;
  long local_930;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined8 local_910;
  float *local_908;
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  char local_8ed;
  undefined4 local_8ec;
  float local_8e8;
  float local_8e4;
  char local_8de;
  char local_8dd;
  int local_8dc;
  long local_8d8;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  void *local_8c0;
  int *local_8b8;
  ulong local_8b0;
  undefined4 local_8a8;
  long *local_8a0;
  int local_898;
  int local_894;
  int local_890;
  undefined4 local_88c;
  undefined4 local_888;
  ulong local_880;
  long local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  long local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  float *local_828;
  int local_81c;
  ulong local_818;
  byte local_80d;
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  reference local_7f8;
  vector<int,_std::allocator<int>_> local_7e8;
  int local_7d0;
  int local_7cc;
  int local_7c8;
  undefined4 local_7c4;
  void *local_7c0;
  int *local_7b8;
  ulong local_7b0;
  undefined4 local_7a8;
  long *local_7a0;
  int local_798;
  int local_794;
  int local_790;
  undefined4 local_78c;
  int local_788;
  long local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  int local_734;
  undefined4 local_730;
  int local_72c;
  undefined4 *local_728;
  undefined4 *local_710;
  int *local_708;
  undefined8 local_700;
  undefined4 local_6f8;
  long *local_6f0;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined8 local_6d0;
  int local_6c4;
  void *local_6c0;
  int *local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  int local_678;
  int local_674;
  long local_670;
  int local_664;
  int local_660;
  int local_65c;
  undefined8 *local_658;
  long *local_650;
  int local_634;
  void **local_630;
  undefined4 **local_628;
  undefined8 *local_618;
  void **local_608;
  undefined8 *local_5f8;
  undefined8 *local_5e8;
  void **local_5d8;
  void **local_5c8;
  long *local_5b8;
  void **local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  int local_594;
  undefined4 **local_590;
  void **local_580;
  undefined4 **local_578;
  long local_570;
  long local_568;
  long local_560;
  long *local_558;
  long local_550;
  long *local_548;
  long local_540;
  long *local_538;
  long local_530;
  long *local_528;
  long local_520;
  long *local_518;
  long local_510;
  long *local_508;
  long local_500;
  long *local_4f8;
  long local_4f0;
  long *local_4e8;
  long local_4e0;
  long *local_4d8;
  long local_4d0;
  long *local_4c8;
  undefined1 local_4bd;
  int local_4bc;
  void **local_4b8;
  undefined8 *local_4b0;
  undefined1 local_49d;
  int local_49c;
  undefined8 *local_490;
  undefined1 local_47d;
  int local_47c;
  void **local_478;
  void **local_470;
  undefined1 local_45d;
  int local_45c;
  undefined8 *local_450;
  undefined8 *local_440;
  undefined8 *local_438;
  long *local_430;
  long *local_428;
  int local_41c;
  undefined8 *local_418;
  int local_40c;
  void **local_408;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3dc;
  long *local_3d8;
  undefined4 local_3d0;
  float local_3cc [3];
  long *local_3c0;
  undefined8 local_3b8;
  long *local_3b0;
  undefined8 local_3a8;
  long *local_3a0;
  undefined8 local_398;
  long *local_390;
  undefined8 local_388;
  long *local_380;
  float local_374;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  float local_360;
  float local_35c;
  float local_358;
  float local_354;
  long *local_350;
  undefined4 local_348;
  float local_344 [3];
  long *local_338;
  undefined8 local_330;
  long *local_328;
  undefined8 local_320;
  long *local_318;
  undefined8 local_310;
  long *local_308;
  undefined8 local_300;
  long *local_2f8;
  int local_2a0;
  undefined4 local_29c;
  void **local_298;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  undefined8 *local_258;
  undefined8 *local_238;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  undefined8 *local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  undefined4 **local_1d8;
  undefined4 *local_1d0;
  void *local_1b0;
  void *local_180;
  void *local_170;
  void **local_140;
  long *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long *local_f8;
  undefined4 local_ec;
  ulong local_e8;
  void *local_e0;
  undefined4 local_d4;
  void **local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  float *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long *local_88;
  undefined4 local_7c;
  ulong local_78;
  void *local_70;
  undefined4 local_64;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_65c = *(int *)((long)in_RSI + 0x2c);
  local_660 = *(int *)(in_RSI + 6);
  local_664 = *(int *)(in_RSI + 7);
  local_670 = in_RSI[2];
  if ((local_664 % *(int *)(in_RDI + 0x108) == 0) &&
     (*(int *)(in_RDI + 0xd0) % *(int *)(in_RDI + 0x108) == 0)) {
    local_674 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
    local_678 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
    local_580 = &local_6c0;
    local_6c0 = (void *)*in_RSI;
    local_6b8 = (int *)in_RSI[1];
    local_6b0 = in_RSI[2];
    local_6a8 = *(undefined4 *)(in_RSI + 3);
    local_6a0 = (long *)in_RSI[4];
    local_698 = *(undefined4 *)(in_RSI + 5);
    local_694 = *(undefined4 *)((long)in_RSI + 0x2c);
    local_690 = *(undefined4 *)(in_RSI + 6);
    local_68c = *(undefined4 *)((long)in_RSI + 0x34);
    local_688 = *(undefined4 *)(in_RSI + 7);
    local_680 = in_RSI[8];
    if (local_6b8 != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_6b8;
      *local_6b8 = *local_6b8 + 1;
      UNLOCK();
    }
    local_650 = in_RDX;
    local_8 = local_580;
    if (local_670 != 1) {
      local_6c4 = local_664 / *(int *)(in_RDI + 0x108);
      local_590 = &local_710;
      local_5a0 = 4;
      local_5a8 = 0;
      local_710 = (undefined4 *)0x0;
      local_708 = (int *)0x0;
      local_700 = 0;
      local_6f8 = 0;
      local_6f0 = (long *)0x0;
      local_6e8 = 0;
      local_6e4 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d0 = 0;
      local_658 = in_RCX;
      local_594 = local_664;
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                  (int)(in_stack_fffffffffffff438 >> 0x20),(size_t)in_stack_fffffffffffff430,
                  (Allocator *)in_stack_fffffffffffff428);
      local_578 = &local_710;
      local_728 = local_710;
      for (local_72c = 0; local_72c < *(int *)(in_RDI + 0x108); local_72c = local_72c + 1) {
        local_4c8 = (long *)(in_RDI + 0x240);
        local_4d0 = (long)local_72c;
        local_730 = *(undefined4 *)(*local_4c8 + local_4d0 * 4);
        for (local_734 = 0; local_734 < local_6c4; local_734 = local_734 + 1) {
          *local_728 = local_730;
          local_728 = local_728 + 1;
        }
      }
      local_778 = *local_658;
      local_768 = *(undefined4 *)(local_658 + 2);
      uStack_764 = *(undefined4 *)((long)local_658 + 0x14);
      uStack_760 = *(undefined4 *)(local_658 + 3);
      uStack_75c = *(undefined4 *)((long)local_658 + 0x1c);
      local_758 = local_658[4];
      uStack_750 = local_658[5];
      local_748 = local_658[6];
      uStack_740 = local_658[7];
      uStack_770 = local_658[2];
      quantize_to_int8(in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530
                       ,in_stack_fffffffffffff528);
      local_628 = &local_710;
      local_1d8 = local_628;
      if (local_708 != (int *)0x0) {
        local_1dc = 0xffffffff;
        LOCK();
        local_1e0 = *local_708;
        *local_708 = *local_708 + -1;
        UNLOCK();
        if (local_1e0 == 1) {
          if (local_6f0 == (long *)0x0) {
            local_1d0 = local_710;
            if (local_710 != (undefined4 *)0x0) {
              free(local_710);
            }
          }
          else {
            (**(code **)(*local_6f0 + 0x18))(local_6f0,local_710);
          }
        }
      }
      local_710 = (undefined4 *)0x0;
      local_700 = 0;
      local_6f8 = 0;
      local_6e8 = 0;
      local_6e4 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d0 = 0;
      local_708 = (int *)0x0;
    }
    local_630 = &local_7c0;
    local_7c0 = (void *)0x0;
    local_7b8 = (int *)0x0;
    local_7b0 = 0;
    local_7a8 = 0;
    local_7a0 = (long *)0x0;
    local_798 = 0;
    local_794 = 0;
    local_790 = 0;
    local_78c = 0;
    local_788 = 0;
    local_780 = 0;
    make_padding(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                 (Mat *)CONCAT44(in_stack_fffffffffffff424,in_stack_fffffffffffff420),
                 in_stack_fffffffffffff418);
    local_5b0 = &local_7c0;
    if (local_7c0 != (void *)0x0) {
      local_140 = local_5b0;
    }
    local_a29 = local_7c0 != (void *)0x0 && local_780 * local_788 != 0;
    if (local_a29) {
      local_65c = local_794;
      local_660 = local_790;
      local_7c8 = (local_794 - local_674) / *(int *)(in_RDI + 0xe4) + 1;
      local_7cc = (local_790 - local_678) / *(int *)(in_RDI + 0xe8) + 1;
      local_7d0 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      std::allocator<int>::allocator((allocator<int> *)0x1248179);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                 in_stack_fffffffffffff438,(allocator_type *)in_stack_fffffffffffff430);
      std::allocator<int>::~allocator((allocator<int> *)0x12481a5);
      local_7f8 = std::vector<int,_std::allocator<int>_>::operator[](&local_7e8,0);
      local_7fc = 0;
      local_800 = 0;
      local_804 = local_65c * *(int *)(in_RDI + 0xe0) -
                  *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xdc);
      for (local_808 = 0; local_808 < *(int *)(in_RDI + 0xd8); local_808 = local_808 + 1) {
        for (local_80c = 0; local_80c < *(int *)(in_RDI + 0xd4); local_80c = local_80c + 1) {
          local_7f8[local_7fc] = local_800;
          local_7fc = local_7fc + 1;
          local_800 = *(int *)(in_RDI + 0xdc) + local_800;
        }
        local_800 = local_804 + local_800;
      }
      local_80d = 100 < *(int *)(in_RDI + 0x10c);
      local_818 = (ulong)(((byte)~local_80d & 1) * 3 + 1);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                  (int)((ulong)in_stack_fffffffffffff448 >> 0x20),(int)in_stack_fffffffffffff448,
                  in_stack_fffffffffffff444,in_stack_fffffffffffff438,
                  (Allocator *)in_stack_fffffffffffff430);
      local_5b8 = local_650;
      bVar3 = true;
      if (*local_650 != 0) {
        local_138 = local_650;
        bVar3 = local_650[8] * (long)(int)local_650[7] == 0;
      }
      if (bVar3) {
        local_634 = -100;
      }
      else {
        if ((local_664 == *(int *)(in_RDI + 0x108)) &&
           (*(int *)(in_RDI + 0x108) == *(int *)(in_RDI + 0xd0))) {
          for (local_81c = 0; local_81c < *(int *)(in_RDI + 0x108); local_81c = local_81c + 1) {
            local_450 = &local_870;
            local_104 = *(int *)((long)local_650 + 0x2c);
            local_108 = (int)local_650[6];
            local_10c = *(undefined4 *)((long)local_650 + 0x34);
            local_828 = (float *)(*local_650 + local_650[8] * (long)local_81c * local_650[2]);
            local_120 = local_650[2];
            local_124 = (undefined4)local_650[3];
            local_130 = local_650[4];
            local_100 = &local_870;
            local_18 = (long)local_104 * (long)local_108 * local_120;
            local_438 = &local_870;
            local_618 = &local_870;
            local_1c = 0x10;
            local_45c = local_81c;
            local_45d = 1;
            local_870 = 0;
            local_860 = 0;
            local_858 = 0;
            local_844 = 0;
            local_840 = 0;
            local_83c = 0;
            local_838 = 0;
            local_868 = 0;
            local_428 = (long *)(in_RDI + 0x168);
            local_878 = *local_428 + (long)(local_7d0 * local_81c);
            local_470 = &local_8c0;
            local_478 = &local_7c0;
            local_e0 = (void *)((long)local_7c0 + local_780 * local_81c * local_7b0);
            local_c8 = &local_8c0;
            local_8b8 = (int *)0x0;
            local_8b0 = local_7b0;
            local_8a8 = local_7a8;
            local_8a0 = local_7a0;
            local_894 = local_794;
            local_890 = local_790;
            local_88c = 1;
            local_888 = local_78c;
            local_28 = (long)local_794 * (long)local_790 * local_7b0;
            local_880 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_7b0;
            local_898 = local_798 + -1;
            if (local_798 == 4) {
              local_880 = (long)local_794 * (long)local_790;
            }
            local_2c = 0x10;
            local_d4 = local_78c;
            local_e8 = local_7b0;
            local_ec = local_7a8;
            local_f8 = local_7a0;
            local_47c = local_81c;
            local_47d = 1;
            local_830 = 0;
            local_848 = 0;
            local_1f8 = local_618;
            local_118 = local_828;
            local_8c0 = local_e0;
            local_850 = local_130;
            for (local_8c4 = 0; local_8c4 < local_7cc; local_8c4 = local_8c4 + 1) {
              for (local_8c8 = 0; local_8c8 < local_7c8; local_8c8 = local_8c8 + 1) {
                local_8cc = 0;
                local_40c = local_8c4 * *(int *)(in_RDI + 0xe8);
                local_408 = &local_8c0;
                local_8d8 = (long)local_8c0 +
                            (long)(local_8c8 * *(int *)(in_RDI + 0xe4)) +
                            (long)local_894 * (long)local_40c * local_8b0;
                for (local_8dc = 0; local_8dc < local_7d0; local_8dc = local_8dc + 1) {
                  local_8dd = *(char *)(local_8d8 + local_7f8[local_8dc]);
                  local_8de = *(char *)(local_878 + local_8dc);
                  local_8cc = (int)local_8dd * (int)local_8de + local_8cc;
                }
                local_4d8 = (long *)(in_RDI + 0x1f8);
                local_4e0 = (long)local_81c;
                fVar4 = *(float *)(*local_4d8 + local_4e0 * 4);
                if ((fVar4 != 0.0) || (NAN(fVar4))) {
                  local_4e8 = (long *)(in_RDI + 0x240);
                  local_4f0 = (long)local_81c;
                  local_4f8 = (long *)(in_RDI + 0x1f8);
                  local_500 = (long)local_81c;
                  local_8e4 = 1.0 / (*(float *)(*local_4e8 + local_4f0 * 4) *
                                    *(float *)(*local_4f8 + local_500 * 4));
                }
                else {
                  local_8e4 = 0.0;
                }
                local_8e8 = (float)local_8cc * local_8e4;
                if (*(int *)(in_RDI + 0x100) != 0) {
                  local_508 = (long *)(in_RDI + 0x1b0);
                  local_510 = (long)local_81c;
                  local_8e8 = *(float *)(*local_508 + local_510 * 4) + local_8e8;
                }
                fVar4 = local_8e8;
                local_348 = *(undefined4 *)(in_RDI + 0x110);
                local_350 = (long *)(in_RDI + 0x118);
                local_344[0] = local_8e8;
                switch(local_348) {
                case 1:
                  if (local_8e8 <= 0.0) {
                    local_344[0] = 0.0;
                  }
                  break;
                case 2:
                  local_300 = 0;
                  local_354 = *(float *)*local_350;
                  if (local_8e8 <= 0.0) {
                    local_af4 = local_8e8 * local_354;
                  }
                  else {
                    local_af4 = local_8e8;
                  }
                  local_344[0] = local_af4;
                  local_2f8 = local_350;
                  break;
                case 3:
                  local_310 = 0;
                  local_358 = *(float *)*local_350;
                  local_320 = 1;
                  local_35c = *(float *)(*local_350 + 4);
                  if (local_8e8 < local_358) {
                    local_344[0] = local_358;
                  }
                  local_318 = local_350;
                  local_308 = local_350;
                  if (local_35c < local_344[0]) {
                    local_344[0] = local_35c;
                  }
                  break;
                case 4:
                  local_360 = 88.37626;
                  pfVar2 = std::min<float>(local_344,&local_360);
                  local_344[0] = *pfVar2;
                  local_364 = -88.37626;
                  pfVar2 = std::max<float>(local_344,&local_364);
                  local_344[0] = *pfVar2;
                  fVar4 = expf(-local_344[0]);
                  local_344[0] = 1.0 / (fVar4 + 1.0);
                  break;
                case 5:
                  fVar5 = expf(local_8e8);
                  fVar5 = logf(fVar5 + 1.0);
                  local_344[0] = tanhf(fVar5);
                  local_344[0] = fVar4 * local_344[0];
                  break;
                case 6:
                  local_330 = 0;
                  local_368 = *(float *)*local_350;
                  local_344[1] = 1.4013e-45;
                  local_344[2] = 0.0;
                  local_36c = *(float *)(*local_350 + 4);
                  local_370 = -local_36c / local_368;
                  local_374 = 1.0 / local_368 + local_370;
                  local_338 = local_350;
                  local_328 = local_350;
                  if (local_370 <= local_8e8) {
                    if (local_8e8 <= local_374) {
                      local_344[0] = local_8e8 * (local_8e8 * local_368 + local_36c);
                    }
                  }
                  else {
                    local_344[0] = 0.0;
                  }
                }
                local_8e8 = local_344[0];
                if ((local_80d & 1) == 0) {
                  *local_828 = local_344[0];
                  local_828 = local_828 + 1;
                }
                else {
                  local_518 = (long *)(in_RDI + 0x288);
                  local_520 = (long)local_81c;
                  local_8ec = *(undefined4 *)(*local_518 + local_520 * 4);
                  local_8ed = float2int8(in_stack_fffffffffffff420);
                  *(char *)local_828 = local_8ed;
                  local_828 = (float *)((long)local_828 + 1);
                }
              }
            }
            local_608 = &local_8c0;
            local_218 = local_608;
            if (local_8b8 != (int *)0x0) {
              local_21c = 0xffffffff;
              LOCK();
              local_220 = *local_8b8;
              *local_8b8 = *local_8b8 + -1;
              UNLOCK();
              if (local_220 == 1) {
                if (local_8a0 == (long *)0x0) {
                  local_1b0 = local_8c0;
                  if (local_8c0 != (void *)0x0) {
                    free(local_8c0);
                  }
                }
                else {
                  (**(code **)(*local_8a0 + 0x18))(local_8a0,local_8c0);
                }
              }
            }
            local_8c0 = (void *)0x0;
            local_8b0 = 0;
            local_8a8 = 0;
            local_898 = 0;
            local_894 = 0;
            local_890 = 0;
            local_88c = 0;
            local_888 = 0;
            local_880 = 0;
            local_8b8 = (int *)0x0;
          }
        }
        else {
          local_8f4 = local_664 / *(int *)(in_RDI + 0x108);
          local_8f8 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x108);
          for (local_8fc = 0; local_8fc < *(int *)(in_RDI + 0x108); local_8fc = local_8fc + 1) {
            for (local_900 = 0; local_900 < local_8f8; local_900 = local_900 + 1) {
              local_49c = local_8fc * local_8f8 + local_900;
              local_490 = &local_950;
              local_94 = *(int *)((long)local_650 + 0x2c);
              local_98 = (int)local_650[6];
              local_9c = *(undefined4 *)((long)local_650 + 0x34);
              local_908 = (float *)(*local_650 + local_650[8] * (long)local_49c * local_650[2]);
              local_b0 = local_650[2];
              local_b4 = (undefined4)local_650[3];
              local_c0 = local_650[4];
              local_90 = &local_950;
              local_38 = (long)local_94 * (long)local_98 * local_b0;
              local_440 = &local_950;
              local_5f8 = &local_950;
              local_3c = 0x10;
              local_49d = 1;
              local_950 = 0;
              local_940 = 0;
              local_938 = 0;
              local_928 = 0;
              local_924 = 0;
              local_920 = 0;
              local_91c = 0;
              local_918 = 0;
              local_910 = 0;
              local_948 = 0;
              local_430 = (long *)(in_RDI + 0x168);
              local_958 = *local_430 + (long)(local_7d0 * local_8f4 * local_8f8 * local_8fc);
              local_238 = local_5f8;
              local_a8 = local_908;
              local_930 = local_c0;
              for (local_95c = 0; local_95c < local_7cc; local_95c = local_95c + 1) {
                for (local_960 = 0; local_960 < local_7c8; local_960 = local_960 + 1) {
                  local_964 = 0;
                  local_970 = local_958 + local_7d0 * local_8f4 * local_900;
                  for (local_974 = 0; local_974 < local_8f4; local_974 = local_974 + 1) {
                    local_4bc = local_8f4 * local_8fc + local_974;
                    local_4b0 = &local_9c0;
                    local_4b8 = &local_7c0;
                    local_70 = (void *)((long)local_7c0 + local_780 * local_4bc * local_7b0);
                    local_58 = &local_9c0;
                    local_9a0 = local_7a0;
                    local_48 = (long)local_794 * (long)local_790 * local_7b0;
                    local_4c = 0x10;
                    local_64 = local_78c;
                    local_78 = local_7b0;
                    local_7c = local_7a8;
                    local_88 = local_7a0;
                    local_4bd = 1;
                    local_41c = local_95c * *(int *)(in_RDI + 0xe8);
                    local_418 = &local_9c0;
                    for (local_9cc = 0; local_9cc < local_7d0; local_9cc = local_9cc + 1) {
                      local_964 = (int)*(char *)((long)local_70 +
                                                (long)local_7f8[local_9cc] +
                                                (long)(local_960 * *(int *)(in_RDI + 0xe4)) +
                                                (long)local_794 * (long)local_41c * local_7b0) *
                                  (int)*(char *)(local_970 + local_9cc) + local_964;
                    }
                    local_970 = local_970 + local_7d0;
                    local_5e8 = &local_9c0;
                    local_9c0 = 0;
                    local_9b0 = 0;
                    local_9a8 = 0;
                    local_998 = 0;
                    local_994 = 0;
                    local_990 = 0;
                    local_98c = 0;
                    local_988 = 0;
                    local_980 = 0;
                    local_9b8 = 0;
                    local_258 = local_5e8;
                  }
                  local_528 = (long *)(in_RDI + 0x1f8);
                  local_530 = (long)local_8fc;
                  fVar4 = *(float *)(*local_528 + local_530 * 4);
                  if ((fVar4 != 0.0) || (NAN(fVar4))) {
                    local_538 = (long *)(in_RDI + 0x240);
                    local_540 = (long)local_8fc;
                    local_548 = (long *)(in_RDI + 0x1f8);
                    local_550 = (long)local_8fc;
                    local_9d4 = 1.0 / (*(float *)(*local_538 + local_540 * 4) *
                                      *(float *)(*local_548 + local_550 * 4));
                  }
                  else {
                    local_9d4 = 0.0;
                  }
                  local_9d8 = (float)local_964 * local_9d4;
                  if (*(int *)(in_RDI + 0x100) != 0) {
                    local_558 = (long *)(in_RDI + 0x1b0);
                    local_560 = (long)(local_8fc * local_8f8 + local_900);
                    local_9d8 = *(float *)(*local_558 + local_560 * 4) + local_9d8;
                  }
                  local_3d0 = *(undefined4 *)(in_RDI + 0x110);
                  local_3d8 = (long *)(in_RDI + 0x118);
                  local_3cc[0] = local_9d8;
                  switch(local_3d0) {
                  case 1:
                    if (local_9d8 <= 0.0) {
                      local_3cc[0] = 0.0;
                    }
                    break;
                  case 2:
                    local_388 = 0;
                    local_3dc = *(float *)*local_3d8;
                    if (local_9d8 <= 0.0) {
                      local_ba4 = local_9d8 * local_3dc;
                    }
                    else {
                      local_ba4 = local_9d8;
                    }
                    local_3cc[0] = local_ba4;
                    local_380 = local_3d8;
                    break;
                  case 3:
                    local_398 = 0;
                    local_3e0 = *(float *)*local_3d8;
                    local_3a8 = 1;
                    local_3e4 = *(float *)(*local_3d8 + 4);
                    if (local_9d8 < local_3e0) {
                      local_3cc[0] = local_3e0;
                    }
                    local_3a0 = local_3d8;
                    local_390 = local_3d8;
                    if (local_3e4 < local_3cc[0]) {
                      local_3cc[0] = local_3e4;
                    }
                    break;
                  case 4:
                    local_3e8 = 88.37626;
                    pfVar2 = std::min<float>(local_3cc,&local_3e8);
                    local_3cc[0] = *pfVar2;
                    local_3ec = -88.37626;
                    pfVar2 = std::max<float>(local_3cc,&local_3ec);
                    local_3cc[0] = *pfVar2;
                    fVar4 = expf(-local_3cc[0]);
                    local_3cc[0] = 1.0 / (fVar4 + 1.0);
                    break;
                  case 5:
                    fVar4 = expf(local_9d8);
                    fVar4 = logf(fVar4 + 1.0);
                    local_3cc[0] = tanhf(fVar4);
                    local_3cc[0] = local_9d8 * local_3cc[0];
                    break;
                  case 6:
                    local_3b8 = 0;
                    local_3f0 = *(float *)*local_3d8;
                    local_3cc[1] = 1.4013e-45;
                    local_3cc[2] = 0.0;
                    local_3f4 = *(float *)(*local_3d8 + 4);
                    local_3f8 = -local_3f4 / local_3f0;
                    local_3fc = 1.0 / local_3f0 + local_3f8;
                    local_3c0 = local_3d8;
                    local_3b0 = local_3d8;
                    if (local_3f8 <= local_9d8) {
                      if (local_9d8 <= local_3fc) {
                        local_3cc[0] = local_9d8 * (local_9d8 * local_3f0 + local_3f4);
                      }
                    }
                    else {
                      local_3cc[0] = 0.0;
                    }
                  }
                  if ((local_80d & 1) == 0) {
                    *local_908 = local_3cc[0];
                    local_908 = local_908 + 1;
                  }
                  else {
                    local_568 = in_RDI + 0x288;
                    local_570 = (long)local_8fc;
                    cVar1 = float2int8(in_stack_fffffffffffff420);
                    *(char *)local_908 = cVar1;
                    local_908 = (float *)((long)local_908 + 1);
                  }
                }
              }
            }
          }
        }
        local_634 = 0;
      }
      local_7c4 = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430);
    }
    else {
      local_634 = -100;
      local_7c4 = 1;
    }
    ppvVar6 = &local_7c0;
    local_5d8 = ppvVar6;
    local_278 = ppvVar6;
    if (local_7b8 != (int *)0x0) {
      local_27c = 0xffffffff;
      LOCK();
      local_280 = *local_7b8;
      *local_7b8 = *local_7b8 + -1;
      UNLOCK();
      if (local_280 == 1) {
        if (local_7a0 == (long *)0x0) {
          local_180 = local_7c0;
          if (local_7c0 != (void *)0x0) {
            free(local_7c0);
          }
        }
        else {
          (**(code **)(*local_7a0 + 0x18))(local_7a0,local_7c0);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
    ppvVar6 = &local_6c0;
    if (local_6b8 != (int *)0x0) {
      local_29c = 0xffffffff;
      LOCK();
      local_2a0 = *local_6b8;
      *local_6b8 = *local_6b8 + -1;
      UNLOCK();
      if (local_2a0 == 1) {
        local_5c8 = ppvVar6;
        local_298 = ppvVar6;
        if (local_6a0 == (long *)0x0) {
          local_170 = local_6c0;
          if (local_6c0 != (void *)0x0) {
            free(local_6c0);
          }
        }
        else {
          (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
  }
  else {
    local_634 = -100;
  }
  return local_634;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}